

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Complex.cpp
# Opt level: O0

void __thiscall Complex::add(Complex *this,Complex *options)

{
  const_iterator __first;
  const_iterator __last;
  double *pdVar1;
  __normal_iterator<AsianGeometricPut_*,_std::vector<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>_>
  local_140;
  const_iterator local_138;
  AsianGeometricCall *local_130;
  AsianGeometricCall *local_128;
  __normal_iterator<const_AsianGeometricCall_*,_std::vector<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>_>
  local_120;
  __normal_iterator<AsianGeometricCall_*,_std::vector<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>_>
  local_118;
  const_iterator local_110;
  AsianArithmeticPut *local_108;
  AsianArithmeticPut *local_100;
  __normal_iterator<const_AsianArithmeticPut_*,_std::vector<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>_>
  local_f8;
  __normal_iterator<AsianArithmeticPut_*,_std::vector<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>_>
  local_f0;
  const_iterator local_e8;
  AsianArithmeticCall *local_e0;
  AsianArithmeticCall *local_d8;
  __normal_iterator<const_AsianArithmeticCall_*,_std::vector<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>_>
  local_d0;
  __normal_iterator<AsianArithmeticCall_*,_std::vector<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>_>
  local_c8;
  const_iterator local_c0;
  DigitalPut *local_b8;
  DigitalPut *local_b0;
  __normal_iterator<const_DigitalPut_*,_std::vector<DigitalPut,_std::allocator<DigitalPut>_>_>
  local_a8;
  __normal_iterator<DigitalPut_*,_std::vector<DigitalPut,_std::allocator<DigitalPut>_>_> local_a0;
  const_iterator local_98;
  DigitalCall *local_90;
  DigitalCall *local_88;
  __normal_iterator<const_DigitalCall_*,_std::vector<DigitalCall,_std::allocator<DigitalCall>_>_>
  local_80;
  __normal_iterator<DigitalCall_*,_std::vector<DigitalCall,_std::allocator<DigitalCall>_>_> local_78
  ;
  const_iterator local_70;
  EuropeanPut *local_68;
  EuropeanPut *local_60;
  __normal_iterator<const_EuropeanPut_*,_std::vector<EuropeanPut,_std::allocator<EuropeanPut>_>_>
  local_58;
  __normal_iterator<EuropeanPut_*,_std::vector<EuropeanPut,_std::allocator<EuropeanPut>_>_> local_50
  ;
  const_iterator local_48;
  EuropeanCall *local_40;
  EuropeanCall *local_38;
  __normal_iterator<const_EuropeanCall_*,_std::vector<EuropeanCall,_std::allocator<EuropeanCall>_>_>
  local_30;
  __normal_iterator<EuropeanCall_*,_std::vector<EuropeanCall,_std::allocator<EuropeanCall>_>_>
  local_28;
  const_iterator local_20;
  Complex *local_18;
  Complex *options_local;
  Complex *this_local;
  
  local_18 = options;
  options_local = this;
  local_28._M_current =
       (EuropeanCall *)
       std::vector<EuropeanCall,_std::allocator<EuropeanCall>_>::end(&this->european_call);
  __gnu_cxx::
  __normal_iterator<EuropeanCall_const*,std::vector<EuropeanCall,std::allocator<EuropeanCall>>>::
  __normal_iterator<EuropeanCall*>
            ((__normal_iterator<EuropeanCall_const*,std::vector<EuropeanCall,std::allocator<EuropeanCall>>>
              *)&local_20,&local_28);
  local_30._M_current =
       (EuropeanCall *)
       std::vector<EuropeanCall,_std::allocator<EuropeanCall>_>::begin(&local_18->european_call);
  local_38 = (EuropeanCall *)
             std::vector<EuropeanCall,_std::allocator<EuropeanCall>_>::end(&local_18->european_call)
  ;
  local_40 = (EuropeanCall *)
             std::vector<EuropeanCall,std::allocator<EuropeanCall>>::
             insert<__gnu_cxx::__normal_iterator<EuropeanCall_const*,std::vector<EuropeanCall,std::allocator<EuropeanCall>>>,void>
                       ((vector<EuropeanCall,std::allocator<EuropeanCall>> *)&this->european_call,
                        local_20,local_30,
                        (__normal_iterator<const_EuropeanCall_*,_std::vector<EuropeanCall,_std::allocator<EuropeanCall>_>_>
                         )local_38);
  local_50._M_current =
       (EuropeanPut *)
       std::vector<EuropeanPut,_std::allocator<EuropeanPut>_>::end(&this->european_put);
  __gnu_cxx::
  __normal_iterator<EuropeanPut_const*,std::vector<EuropeanPut,std::allocator<EuropeanPut>>>::
  __normal_iterator<EuropeanPut*>
            ((__normal_iterator<EuropeanPut_const*,std::vector<EuropeanPut,std::allocator<EuropeanPut>>>
              *)&local_48,&local_50);
  local_58._M_current =
       (EuropeanPut *)
       std::vector<EuropeanPut,_std::allocator<EuropeanPut>_>::begin(&local_18->european_put);
  local_60 = (EuropeanPut *)
             std::vector<EuropeanPut,_std::allocator<EuropeanPut>_>::end(&local_18->european_put);
  local_68 = (EuropeanPut *)
             std::vector<EuropeanPut,std::allocator<EuropeanPut>>::
             insert<__gnu_cxx::__normal_iterator<EuropeanPut_const*,std::vector<EuropeanPut,std::allocator<EuropeanPut>>>,void>
                       ((vector<EuropeanPut,std::allocator<EuropeanPut>> *)&this->european_put,
                        local_48,local_58,
                        (__normal_iterator<const_EuropeanPut_*,_std::vector<EuropeanPut,_std::allocator<EuropeanPut>_>_>
                         )local_60);
  local_78._M_current =
       (DigitalCall *)
       std::vector<DigitalCall,_std::allocator<DigitalCall>_>::end(&this->digital_call);
  __gnu_cxx::
  __normal_iterator<DigitalCall_const*,std::vector<DigitalCall,std::allocator<DigitalCall>>>::
  __normal_iterator<DigitalCall*>
            ((__normal_iterator<DigitalCall_const*,std::vector<DigitalCall,std::allocator<DigitalCall>>>
              *)&local_70,&local_78);
  local_80._M_current =
       (DigitalCall *)
       std::vector<DigitalCall,_std::allocator<DigitalCall>_>::begin(&local_18->digital_call);
  local_88 = (DigitalCall *)
             std::vector<DigitalCall,_std::allocator<DigitalCall>_>::end(&local_18->digital_call);
  local_90 = (DigitalCall *)
             std::vector<DigitalCall,std::allocator<DigitalCall>>::
             insert<__gnu_cxx::__normal_iterator<DigitalCall_const*,std::vector<DigitalCall,std::allocator<DigitalCall>>>,void>
                       ((vector<DigitalCall,std::allocator<DigitalCall>> *)&this->digital_call,
                        local_70,local_80,
                        (__normal_iterator<const_DigitalCall_*,_std::vector<DigitalCall,_std::allocator<DigitalCall>_>_>
                         )local_88);
  local_a0._M_current =
       (DigitalPut *)std::vector<DigitalPut,_std::allocator<DigitalPut>_>::end(&this->digital_put);
  __gnu_cxx::__normal_iterator<DigitalPut_const*,std::vector<DigitalPut,std::allocator<DigitalPut>>>
  ::__normal_iterator<DigitalPut*>
            ((__normal_iterator<DigitalPut_const*,std::vector<DigitalPut,std::allocator<DigitalPut>>>
              *)&local_98,&local_a0);
  local_a8._M_current =
       (DigitalPut *)
       std::vector<DigitalPut,_std::allocator<DigitalPut>_>::begin(&local_18->digital_put);
  local_b0 = (DigitalPut *)
             std::vector<DigitalPut,_std::allocator<DigitalPut>_>::end(&local_18->digital_put);
  local_b8 = (DigitalPut *)
             std::vector<DigitalPut,std::allocator<DigitalPut>>::
             insert<__gnu_cxx::__normal_iterator<DigitalPut_const*,std::vector<DigitalPut,std::allocator<DigitalPut>>>,void>
                       ((vector<DigitalPut,std::allocator<DigitalPut>> *)&this->digital_put,local_98
                        ,local_a8,
                        (__normal_iterator<const_DigitalPut_*,_std::vector<DigitalPut,_std::allocator<DigitalPut>_>_>
                         )local_b0);
  local_c8._M_current =
       (AsianArithmeticCall *)
       std::vector<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>::end
                 (&this->asian_arithmetic_call);
  __gnu_cxx::
  __normal_iterator<AsianArithmeticCall_const*,std::vector<AsianArithmeticCall,std::allocator<AsianArithmeticCall>>>
  ::__normal_iterator<AsianArithmeticCall*>
            ((__normal_iterator<AsianArithmeticCall_const*,std::vector<AsianArithmeticCall,std::allocator<AsianArithmeticCall>>>
              *)&local_c0,&local_c8);
  local_d0._M_current =
       (AsianArithmeticCall *)
       std::vector<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>::begin
                 (&local_18->asian_arithmetic_call);
  local_d8 = (AsianArithmeticCall *)
             std::vector<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>::end
                       (&local_18->asian_arithmetic_call);
  local_e0 = (AsianArithmeticCall *)
             std::vector<AsianArithmeticCall,std::allocator<AsianArithmeticCall>>::
             insert<__gnu_cxx::__normal_iterator<AsianArithmeticCall_const*,std::vector<AsianArithmeticCall,std::allocator<AsianArithmeticCall>>>,void>
                       ((vector<AsianArithmeticCall,std::allocator<AsianArithmeticCall>> *)
                        &this->asian_arithmetic_call,local_c0,local_d0,
                        (__normal_iterator<const_AsianArithmeticCall_*,_std::vector<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>_>
                         )local_d8);
  local_f0._M_current =
       (AsianArithmeticPut *)
       std::vector<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>::end
                 (&this->asian_arithmetic_put);
  __gnu_cxx::
  __normal_iterator<AsianArithmeticPut_const*,std::vector<AsianArithmeticPut,std::allocator<AsianArithmeticPut>>>
  ::__normal_iterator<AsianArithmeticPut*>
            ((__normal_iterator<AsianArithmeticPut_const*,std::vector<AsianArithmeticPut,std::allocator<AsianArithmeticPut>>>
              *)&local_e8,&local_f0);
  local_f8._M_current =
       (AsianArithmeticPut *)
       std::vector<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>::begin
                 (&local_18->asian_arithmetic_put);
  local_100 = (AsianArithmeticPut *)
              std::vector<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>::end
                        (&local_18->asian_arithmetic_put);
  local_108 = (AsianArithmeticPut *)
              std::vector<AsianArithmeticPut,std::allocator<AsianArithmeticPut>>::
              insert<__gnu_cxx::__normal_iterator<AsianArithmeticPut_const*,std::vector<AsianArithmeticPut,std::allocator<AsianArithmeticPut>>>,void>
                        ((vector<AsianArithmeticPut,std::allocator<AsianArithmeticPut>> *)
                         &this->asian_arithmetic_put,local_e8,local_f8,
                         (__normal_iterator<const_AsianArithmeticPut_*,_std::vector<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>_>
                          )local_100);
  local_118._M_current =
       (AsianGeometricCall *)
       std::vector<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>::end
                 (&this->asian_geometric_call);
  __gnu_cxx::
  __normal_iterator<AsianGeometricCall_const*,std::vector<AsianGeometricCall,std::allocator<AsianGeometricCall>>>
  ::__normal_iterator<AsianGeometricCall*>
            ((__normal_iterator<AsianGeometricCall_const*,std::vector<AsianGeometricCall,std::allocator<AsianGeometricCall>>>
              *)&local_110,&local_118);
  local_120._M_current =
       (AsianGeometricCall *)
       std::vector<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>::begin
                 (&local_18->asian_geometric_call);
  local_128 = (AsianGeometricCall *)
              std::vector<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>::end
                        (&local_18->asian_geometric_call);
  local_130 = (AsianGeometricCall *)
              std::vector<AsianGeometricCall,std::allocator<AsianGeometricCall>>::
              insert<__gnu_cxx::__normal_iterator<AsianGeometricCall_const*,std::vector<AsianGeometricCall,std::allocator<AsianGeometricCall>>>,void>
                        ((vector<AsianGeometricCall,std::allocator<AsianGeometricCall>> *)
                         &this->asian_geometric_call,local_110,local_120,
                         (__normal_iterator<const_AsianGeometricCall_*,_std::vector<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>_>
                          )local_128);
  local_140._M_current =
       (AsianGeometricPut *)
       std::vector<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>::end
                 (&this->asian_geometric_put);
  __gnu_cxx::
  __normal_iterator<AsianGeometricPut_const*,std::vector<AsianGeometricPut,std::allocator<AsianGeometricPut>>>
  ::__normal_iterator<AsianGeometricPut*>
            ((__normal_iterator<AsianGeometricPut_const*,std::vector<AsianGeometricPut,std::allocator<AsianGeometricPut>>>
              *)&local_138,&local_140);
  __first = std::vector<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>::begin
                      (&local_18->asian_geometric_put);
  __last = std::vector<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>::end
                     (&local_18->asian_geometric_put);
  std::vector<AsianGeometricPut,std::allocator<AsianGeometricPut>>::
  insert<__gnu_cxx::__normal_iterator<AsianGeometricPut_const*,std::vector<AsianGeometricPut,std::allocator<AsianGeometricPut>>>,void>
            ((vector<AsianGeometricPut,std::allocator<AsianGeometricPut>> *)
             &this->asian_geometric_put,local_138,
             (__normal_iterator<const_AsianGeometricPut_*,_std::vector<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>_>
              )__first._M_current,
             (__normal_iterator<const_AsianGeometricPut_*,_std::vector<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>_>
              )__last._M_current);
  pdVar1 = std::max<double>(&this->max_T,&local_18->max_T);
  this->max_T = *pdVar1;
  return;
}

Assistant:

void Complex::add(Complex const& options)
{
	european_call.insert(european_call.end(), options.european_call.begin(), options.european_call.end());
	european_put.insert(european_put.end(), options.european_put.begin(), options.european_put.end());
	digital_call.insert(digital_call.end(), options.digital_call.begin(), options.digital_call.end());
	digital_put.insert(digital_put.end(), options.digital_put.begin(), options.digital_put.end());
	asian_arithmetic_call.insert(asian_arithmetic_call.end(), options.asian_arithmetic_call.begin(), options.asian_arithmetic_call.end());
	asian_arithmetic_put.insert(asian_arithmetic_put.end(), options.asian_arithmetic_put.begin(), options.asian_arithmetic_put.end());
	asian_geometric_call.insert(asian_geometric_call.end(), options.asian_geometric_call.begin(), options.asian_geometric_call.end());
	asian_geometric_put.insert(asian_geometric_put.end(), options.asian_geometric_put.begin(), options.asian_geometric_put.end());

	max_T = std::max(max_T, options.max_T);
}